

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O3

int sp_symetree(int *acolst,int *acolend,int *arow,int n,int *parent)

{
  int *addr;
  int *addr_00;
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  
  addr = mxCallocInt(n);
  addr_00 = mxCallocInt(n);
  if (0 < n) {
    uVar2 = 0;
    do {
      iVar1 = (int)uVar2;
      addr_00[uVar2] = iVar1;
      addr[uVar2] = iVar1;
      parent[uVar2] = n;
      lVar3 = (long)acolst[uVar2];
      if (acolst[uVar2] < acolend[uVar2]) {
        uVar4 = uVar2 & 0xffffffff;
        do {
          lVar9 = (long)arow[lVar3];
          uVar6 = (uint)uVar4;
          if (lVar9 < (long)uVar2) {
            uVar5 = addr_00[lVar9];
            lVar7 = (long)(int)uVar5;
            uVar8 = addr_00[lVar7];
            if (uVar8 != uVar5) {
              do {
                addr_00[lVar9] = uVar8;
                lVar9 = (long)(int)uVar8;
                uVar5 = addr_00[lVar9];
                lVar7 = (long)(int)uVar5;
                uVar8 = addr_00[lVar7];
              } while (uVar8 != uVar5);
            }
            if (uVar2 != (uint)addr[lVar7]) {
              parent[addr[lVar7]] = iVar1;
              addr_00[(int)uVar6] = uVar5;
              addr[lVar7] = iVar1;
              uVar6 = uVar5;
            }
          }
          lVar3 = lVar3 + 1;
          uVar4 = (ulong)uVar6;
        } while (lVar3 < acolend[uVar2]);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)n);
  }
  superlu_free(addr);
  superlu_free(addr_00);
  return 0;
}

Assistant:

int sp_symetree(
                const int *acolst, const int *acolend, /* column starts and ends past 1 */
                const int *arow,            /* row indices of A */
                int n,                /* dimension of A */
                int *parent)    /* parent in elim tree */
{
	int	*root;		    /* root of subtree of etree 	*/
	int	rset, cset;             
	int	row, col;
	int	rroot;
	int	p;
	int     *pp;

	root = mxCallocInt (n);
	initialize_disjoint_sets (n, &pp);

	for (col = 0; col < n; col++) {
		cset = make_set (col, pp);
		root[cset] = col;
		parent[col] = n; /* Matlab */
		for (p = acolst[col]; p < acolend[col]; p++) {
			row = arow[p];
			if (row >= col) continue;
			rset = find (row, pp);
			rroot = root[rset];
			if (rroot != col) {
				parent[rroot] = col;
				cset = link (cset, rset, pp);
				root[cset] = col;
			}
		}
	}
	SUPERLU_FREE (root);
	finalize_disjoint_sets (pp);
	return 0;
}